

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v.c
# Opt level: O0

void m256v_swap_cols(m256v *M,int c1,int c2)

{
  uint8_t uVar1;
  int in_EDX;
  int in_ESI;
  m256v *in_RDI;
  uint8_t sw;
  int i;
  size_t o2;
  size_t o1;
  int local_24;
  size_t local_20;
  size_t local_18;
  
  if (in_ESI != in_EDX) {
    local_18 = m256v_get_el_offs(in_RDI,0,in_ESI);
    local_20 = m256v_get_el_offs(in_RDI,0,in_EDX);
    for (local_24 = 0; local_24 < in_RDI->n_row; local_24 = local_24 + 1) {
      uVar1 = in_RDI->e[local_18];
      in_RDI->e[local_18] = in_RDI->e[local_20];
      in_RDI->e[local_20] = uVar1;
      local_18 = in_RDI->rstride + local_18;
      local_20 = in_RDI->rstride + local_20;
    }
  }
  return;
}

Assistant:

void m256v_swap_cols(m256v* M, int c1, int c2)
{
	if (c1 == c2)
		return;

	size_t o1 = get_el_offs(M, 0, c1);
	size_t o2 = get_el_offs(M, 0, c2);
	for (int i = 0; i < M->n_row; ++i) {
		const uint8_t sw = M->e[o1];
		M->e[o1] = M->e[o2];
		M->e[o2] = sw;
		o1 += M->rstride;
		o2 += M->rstride;
	}
}